

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

void __thiscall
google::protobuf::DescriptorBuilder::BuildReservedRange
          (DescriptorBuilder *this,ReservedRange *proto,Descriptor *parent,ReservedRange *result,
          FlatAllocator *param_4)

{
  int32_t iVar1;
  MappedReference<absl::lts_20250127::container_internal::FlatHashMapPolicy<const_google::protobuf::Descriptor_*,_google::protobuf::DescriptorBuilder::MessageHints>_>
  this_00;
  string_view sVar2;
  FlatAllocator *param_4_local;
  ReservedRange *result_local;
  Descriptor *parent_local;
  ReservedRange *proto_local;
  DescriptorBuilder *this_local;
  
  result_local = (ReservedRange *)parent;
  parent_local = (Descriptor *)proto;
  proto_local = (ReservedRange *)this;
  iVar1 = DescriptorProto_ReservedRange::start(proto);
  result->start = iVar1;
  iVar1 = DescriptorProto_ReservedRange::end((DescriptorProto_ReservedRange *)parent_local);
  result->end = iVar1;
  if (result->start < 1) {
    this_00 = absl::lts_20250127::container_internal::
              raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<google::protobuf::Descriptor_const*,google::protobuf::DescriptorBuilder::MessageHints>,absl::lts_20250127::container_internal::HashEq<google::protobuf::Descriptor_const*,void>::Hash,absl::lts_20250127::container_internal::HashEq<google::protobuf::Descriptor_const*,void>::Eq,std::allocator<std::pair<google::protobuf::Descriptor_const*const,google::protobuf::DescriptorBuilder::MessageHints>>>
              ::
              operator[]<google::protobuf::Descriptor_const*,absl::lts_20250127::container_internal::FlatHashMapPolicy<google::protobuf::Descriptor_const*,google::protobuf::DescriptorBuilder::MessageHints>>
                        ((raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<google::protobuf::Descriptor_const*,google::protobuf::DescriptorBuilder::MessageHints>,absl::lts_20250127::container_internal::HashEq<google::protobuf::Descriptor_const*,void>::Hash,absl::lts_20250127::container_internal::HashEq<google::protobuf::Descriptor_const*,void>::Eq,std::allocator<std::pair<google::protobuf::Descriptor_const*const,google::protobuf::DescriptorBuilder::MessageHints>>>
                          *)&this->message_hints_,
                         (key_arg<const_google::protobuf::Descriptor_*> *)&result_local);
    MessageHints::RequestHintOnFieldNumbers
              (this_00,(Message *)parent_local,NUMBER,result->start,result->end);
    sVar2 = Descriptor::full_name((Descriptor *)result_local);
    AddError(this,sVar2,(Message *)parent_local,NUMBER,"Reserved numbers must be positive integers."
            );
  }
  if (result->end <= result->start) {
    sVar2 = Descriptor::full_name((Descriptor *)result_local);
    AddError(this,sVar2,(Message *)parent_local,NUMBER,
             "Reserved range end number must be greater than start number.");
  }
  return;
}

Assistant:

void DescriptorBuilder::BuildReservedRange(
    const DescriptorProto::ReservedRange& proto, const Descriptor* parent,
    Descriptor::ReservedRange* result, internal::FlatAllocator&) {
  result->start = proto.start();
  result->end = proto.end();
  if (result->start <= 0) {
    message_hints_[parent].RequestHintOnFieldNumbers(
        proto, DescriptorPool::ErrorCollector::NUMBER, result->start,
        result->end);
    AddError(parent->full_name(), proto, DescriptorPool::ErrorCollector::NUMBER,
             "Reserved numbers must be positive integers.");
  }
  if (result->start >= result->end) {
    AddError(parent->full_name(), proto, DescriptorPool::ErrorCollector::NUMBER,
             "Reserved range end number must be greater than start number.");
  }
}